

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_38e3a9::ThrowExpr::printLeft(ThrowExpr *this,OutputStream *S)

{
  StringView R;
  
  R.Last = "";
  R.First = "throw ";
  OutputStream::operator+=(S,R);
  Node::print(this->Op,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "throw ";
    Op->print(S);
  }